

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall cmake::ActualConfigure(cmake *this)

{
  cmState *pcVar1;
  cmMakefile *this_00;
  bool bVar2;
  bool bVar3;
  WorkingMode WVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  cmGlobalGenerator *pcVar8;
  ulong uVar9;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *this_01;
  const_reference ppcVar10;
  char *local_528;
  allocator local_4c1;
  string local_4c0;
  byte local_49b;
  byte local_49a;
  allocator local_499;
  string local_498;
  allocator local_471;
  string local_470;
  cmMakefile *local_450;
  cmMakefile *mf;
  string local_440;
  allocator local_419;
  string local_418;
  allocator local_3f1;
  string local_3f0;
  allocator local_3c9;
  string local_3c8;
  allocator local_3a1;
  string local_3a0;
  allocator local_379;
  string local_378;
  allocator local_351;
  string local_350 [8];
  string message_2;
  string local_328;
  char *local_308;
  char *tsName;
  string local_2f8;
  allocator local_2d1;
  string local_2d0 [8];
  string message_1;
  string local_2a8;
  char *local_288;
  char *platformName;
  allocator local_259;
  string local_258;
  string local_238 [39];
  allocator local_211;
  string local_210;
  allocator local_1e9;
  string local_1e8;
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [8];
  string message;
  string local_178 [39];
  allocator local_151;
  string local_150;
  char *local_130;
  char *genName;
  string local_120;
  allocator local_f9;
  string local_f8;
  undefined1 local_d8 [8];
  string fullName;
  string local_b0;
  char *local_90;
  char *extraGenName;
  string local_80;
  char *local_60;
  char *genName_1;
  allocator local_41;
  string local_40;
  int local_1c;
  cmake *pcStack_18;
  int res;
  cmake *this_local;
  
  pcStack_18 = this;
  UpdateConversionPathTable(this);
  CleanupCommandsAndMacros(this);
  local_1c = 0;
  WVar4 = GetWorkingMode(this);
  if (WVar4 == NORMAL_MODE) {
    local_1c = DoPreConfigureChecks(this);
  }
  if (local_1c < 0) {
    this_local._4_4_ = -2;
  }
  else {
    if (local_1c == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_40,"CMAKE_HOME_DIRECTORY",&local_41);
      pcVar6 = GetHomeDirectory(this);
      AddCacheEntry(this,&local_40,pcVar6,
                    "Source directory with the top level CMakeLists.txt file for this project",4);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator((allocator<char> *)&local_41);
    }
    if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
      pcVar1 = this->State;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_80,"CMAKE_GENERATOR",(allocator *)((long)&extraGenName + 7));
      pcVar6 = cmState::GetInitializedCacheValue(pcVar1,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator((allocator<char> *)((long)&extraGenName + 7));
      pcVar1 = this->State;
      local_60 = pcVar6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_b0,"CMAKE_EXTRA_GENERATOR",
                 (allocator *)(fullName.field_2._M_local_buf + 0xf));
      pcVar7 = cmState::GetInitializedCacheValue(pcVar1,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator((allocator<char> *)(fullName.field_2._M_local_buf + 0xf));
      pcVar6 = local_60;
      local_90 = pcVar7;
      if (local_60 != (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_f8,pcVar6,&local_f9);
        if (local_90 == (char *)0x0) {
          local_528 = "";
        }
        else {
          local_528 = local_90;
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_120,local_528,(allocator *)((long)&genName + 7));
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName
                  ((string *)local_d8,&local_f8,&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        std::allocator<char>::~allocator((allocator<char> *)((long)&genName + 7));
        std::__cxx11::string::~string((string *)&local_f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_f9);
        pcVar8 = CreateGlobalGenerator(this,(string *)local_d8);
        this->GlobalGenerator = pcVar8;
        std::__cxx11::string::~string((string *)local_d8);
      }
      if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
        CreateDefaultGlobalGenerator(this);
      }
      else {
        bVar2 = cmGlobalGenerator::GetForceUnixPaths(this->GlobalGenerator);
        cmSystemTools::SetForceUnixPaths(bVar2);
      }
      if (this->GlobalGenerator == (cmGlobalGenerator *)0x0) {
        cmSystemTools::Error("Could not create generator",(char *)0x0,(char *)0x0,(char *)0x0);
        return -1;
      }
    }
    pcVar1 = this->State;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_150,"CMAKE_GENERATOR",&local_151);
    pcVar6 = cmState::GetInitializedCacheValue(pcVar1,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator((allocator<char> *)&local_151);
    local_130 = pcVar6;
    if (pcVar6 != (char *)0x0) {
      pcVar8 = this->GlobalGenerator;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_178,pcVar6,(allocator *)(message.field_2._M_local_buf + 0xf));
      iVar5 = (*pcVar8->_vptr_cmGlobalGenerator[4])(pcVar8,local_178);
      std::__cxx11::string::~string(local_178);
      std::allocator<char>::~allocator((allocator<char> *)(message.field_2._M_local_buf + 0xf));
      if ((((byte)iVar5 ^ 0xff) & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1a0,"Error: generator : ",&local_1a1);
        std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
        (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(local_1c8);
        std::__cxx11::string::operator+=(local_1a0,local_1c8);
        std::__cxx11::string::~string(local_1c8);
        std::__cxx11::string::operator+=
                  (local_1a0,"\nDoes not match the generator used previously: ");
        std::__cxx11::string::operator+=(local_1a0,local_130);
        std::__cxx11::string::operator+=
                  (local_1a0,
                   "\nEither remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                  );
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmSystemTools::Error(pcVar6,(char *)0x0,(char *)0x0,(char *)0x0);
        this_local._4_4_ = -2;
        std::__cxx11::string::~string(local_1a0);
        return this_local._4_4_;
      }
    }
    pcVar1 = this->State;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1e8,"CMAKE_GENERATOR",&local_1e9);
    pcVar6 = cmState::GetInitializedCacheValue(pcVar1,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    if (pcVar6 == (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_210,"CMAKE_GENERATOR",&local_211);
      (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(local_238);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      AddCacheEntry(this,&local_210,pcVar6,"Name of generator.",4);
      std::__cxx11::string::~string(local_238);
      std::__cxx11::string::~string((string *)&local_210);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_258,"CMAKE_EXTRA_GENERATOR",&local_259);
      cmGlobalGenerator::GetExtraGeneratorName_abi_cxx11_
                ((string *)&platformName,this->GlobalGenerator);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      AddCacheEntry(this,&local_258,pcVar6,"Name of external makefile project generator.",4);
      std::__cxx11::string::~string((string *)&platformName);
      std::__cxx11::string::~string((string *)&local_258);
      std::allocator<char>::~allocator((allocator<char> *)&local_259);
    }
    pcVar1 = this->State;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_2a8,"CMAKE_GENERATOR_PLATFORM",
               (allocator *)(message_1.field_2._M_local_buf + 0xf));
    pcVar6 = cmState::GetInitializedCacheValue(pcVar1,&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator((allocator<char> *)(message_1.field_2._M_local_buf + 0xf));
    local_288 = pcVar6;
    if (pcVar6 == (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2f8,"CMAKE_GENERATOR_PLATFORM",(allocator *)((long)&tsName + 7));
      pcVar6 = (char *)std::__cxx11::string::c_str();
      AddCacheEntry(this,&local_2f8,pcVar6,"Name of generator platform.",4);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&tsName + 7));
    }
    else {
      uVar9 = std::__cxx11::string::empty();
      if ((uVar9 & 1) == 0) {
        bVar2 = std::operator!=(&this->GeneratorPlatform,local_288);
        if (bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2d0,"Error: generator platform: ",&local_2d1);
          std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
          std::__cxx11::string::operator+=(local_2d0,(string *)&this->GeneratorPlatform);
          std::__cxx11::string::operator+=
                    (local_2d0,"\nDoes not match the platform used previously: ");
          std::__cxx11::string::operator+=(local_2d0,local_288);
          std::__cxx11::string::operator+=
                    (local_2d0,
                     "\nEither remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                    );
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmSystemTools::Error(pcVar6,(char *)0x0,(char *)0x0,(char *)0x0);
          this_local._4_4_ = -2;
          std::__cxx11::string::~string(local_2d0);
          return this_local._4_4_;
        }
      }
      else {
        std::__cxx11::string::operator=((string *)&this->GeneratorPlatform,local_288);
      }
    }
    pcVar1 = this->State;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_328,"CMAKE_GENERATOR_TOOLSET",
               (allocator *)(message_2.field_2._M_local_buf + 0xf));
    pcVar6 = cmState::GetInitializedCacheValue(pcVar1,&local_328);
    std::__cxx11::string::~string((string *)&local_328);
    std::allocator<char>::~allocator((allocator<char> *)(message_2.field_2._M_local_buf + 0xf));
    local_308 = pcVar6;
    if (pcVar6 == (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_378,"CMAKE_GENERATOR_TOOLSET",&local_379);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      AddCacheEntry(this,&local_378,pcVar6,"Name of generator toolset.",4);
      std::__cxx11::string::~string((string *)&local_378);
      std::allocator<char>::~allocator((allocator<char> *)&local_379);
    }
    else {
      uVar9 = std::__cxx11::string::empty();
      if ((uVar9 & 1) == 0) {
        bVar2 = std::operator!=(&this->GeneratorToolset,local_308);
        if (bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_350,"Error: generator toolset: ",&local_351);
          std::allocator<char>::~allocator((allocator<char> *)&local_351);
          std::__cxx11::string::operator+=(local_350,(string *)&this->GeneratorToolset);
          std::__cxx11::string::operator+=
                    (local_350,"\nDoes not match the toolset used previously: ");
          std::__cxx11::string::operator+=(local_350,local_308);
          std::__cxx11::string::operator+=
                    (local_350,
                     "\nEither remove the CMakeCache.txt file and CMakeFiles directory or choose a different binary directory."
                    );
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmSystemTools::Error(pcVar6,(char *)0x0,(char *)0x0,(char *)0x0);
          this_local._4_4_ = -2;
          std::__cxx11::string::~string(local_350);
          return this_local._4_4_;
        }
      }
      else {
        std::__cxx11::string::operator=((string *)&this->GeneratorToolset,local_308);
      }
    }
    bVar2 = cmState::GetIsInTryCompile(this->State);
    if (!bVar2) {
      cmGlobalGenerator::ClearEnabledLanguages(this->GlobalGenerator);
      TruncateOutputLog(this,"CMakeOutput.log");
      TruncateOutputLog(this,"CMakeError.log");
    }
    (*this->GlobalGenerator->_vptr_cmGlobalGenerator[9])();
    pcVar1 = this->State;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_3a0,"CMAKE_BACKWARDS_COMPATIBILITY",&local_3a1);
    pcVar6 = cmState::GetInitializedCacheValue(pcVar1,&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_3a1);
    if (pcVar6 != (char *)0x0) {
      pcVar1 = this->State;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_3c8,"LIBRARY_OUTPUT_PATH",&local_3c9);
      pcVar6 = cmState::GetInitializedCacheValue(pcVar1,&local_3c8);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
      if (pcVar6 == (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_3f0,"LIBRARY_OUTPUT_PATH",&local_3f1);
        AddCacheEntry(this,&local_3f0,"","Single output directory for building all libraries.",1);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
      }
      pcVar1 = this->State;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_418,"EXECUTABLE_OUTPUT_PATH",&local_419);
      pcVar6 = cmState::GetInitializedCacheValue(pcVar1,&local_418);
      std::__cxx11::string::~string((string *)&local_418);
      std::allocator<char>::~allocator((allocator<char> *)&local_419);
      if (pcVar6 == (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_440,"EXECUTABLE_OUTPUT_PATH",(allocator *)((long)&mf + 7));
        AddCacheEntry(this,&local_440,"","Single output directory for building all executables.",1);
        std::__cxx11::string::~string((string *)&local_440);
        std::allocator<char>::~allocator((allocator<char> *)((long)&mf + 7));
      }
    }
    this_01 = cmGlobalGenerator::GetMakefiles(this->GlobalGenerator);
    ppcVar10 = std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::operator[](this_01,0);
    this_00 = *ppcVar10;
    local_450 = this_00;
    std::allocator<char>::allocator();
    local_49a = 0;
    local_49b = 0;
    std::__cxx11::string::string((string *)&local_470,"CTEST_USE_LAUNCHERS",&local_471);
    bVar3 = cmMakefile::IsOn(this_00,&local_470);
    bVar2 = false;
    if (bVar3) {
      pcVar1 = this->State;
      std::allocator<char>::allocator();
      local_49a = 1;
      std::__cxx11::string::string((string *)&local_498,"RULE_LAUNCH_COMPILE",&local_499);
      local_49b = 1;
      pcVar6 = cmState::GetGlobalProperty(pcVar1,&local_498);
      bVar2 = pcVar6 == (char *)0x0;
    }
    if ((local_49b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_498);
    }
    if ((local_49a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_499);
    }
    std::__cxx11::string::~string((string *)&local_470);
    std::allocator<char>::~allocator((allocator<char> *)&local_471);
    if (bVar2) {
      cmSystemTools::Error
                ("CTEST_USE_LAUNCHERS is enabled, but the RULE_LAUNCH_COMPILE global property is not defined.\nDid you forget to include(CTest) in the toplevel CMakeLists.txt ?"
                 ,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    WVar4 = GetWorkingMode(this);
    if (WVar4 == NORMAL_MODE) {
      pcVar6 = GetHomeOutputDirectory(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_4c0,pcVar6,&local_4c1);
      SaveCache(this,&local_4c0);
      std::__cxx11::string::~string((string *)&local_4c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4c1);
    }
    bVar2 = cmSystemTools::GetErrorOccuredFlag();
    if (bVar2) {
      this_local._4_4_ = -1;
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int cmake::ActualConfigure()
{
  // Construct right now our path conversion table before it's too late:
  this->UpdateConversionPathTable();
  this->CleanupCommandsAndMacros();

  int res = 0;
  if (this->GetWorkingMode() == NORMAL_MODE) {
    res = this->DoPreConfigureChecks();
  }
  if (res < 0) {
    return -2;
  }
  if (!res) {
    this->AddCacheEntry(
      "CMAKE_HOME_DIRECTORY", this->GetHomeDirectory(),
      "Source directory with the top level CMakeLists.txt file for this "
      "project",
      cmStateEnums::INTERNAL);
  }

  // no generator specified on the command line
  if (!this->GlobalGenerator) {
    const char* genName =
      this->State->GetInitializedCacheValue("CMAKE_GENERATOR");
    const char* extraGenName =
      this->State->GetInitializedCacheValue("CMAKE_EXTRA_GENERATOR");
    if (genName) {
      std::string fullName =
        cmExternalMakefileProjectGenerator::CreateFullGeneratorName(
          genName, extraGenName ? extraGenName : "");
      this->GlobalGenerator = this->CreateGlobalGenerator(fullName);
    }
    if (this->GlobalGenerator) {
      // set the global flag for unix style paths on cmSystemTools as
      // soon as the generator is set.  This allows gmake to be used
      // on windows.
      cmSystemTools::SetForceUnixPaths(
        this->GlobalGenerator->GetForceUnixPaths());
    } else {
      this->CreateDefaultGlobalGenerator();
    }
    if (!this->GlobalGenerator) {
      cmSystemTools::Error("Could not create generator");
      return -1;
    }
  }

  const char* genName =
    this->State->GetInitializedCacheValue("CMAKE_GENERATOR");
  if (genName) {
    if (!this->GlobalGenerator->MatchesGeneratorName(genName)) {
      std::string message = "Error: generator : ";
      message += this->GlobalGenerator->GetName();
      message += "\nDoes not match the generator used previously: ";
      message += genName;
      message += "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.";
      cmSystemTools::Error(message.c_str());
      return -2;
    }
  }
  if (!this->State->GetInitializedCacheValue("CMAKE_GENERATOR")) {
    this->AddCacheEntry("CMAKE_GENERATOR",
                        this->GlobalGenerator->GetName().c_str(),
                        "Name of generator.", cmStateEnums::INTERNAL);
    this->AddCacheEntry("CMAKE_EXTRA_GENERATOR",
                        this->GlobalGenerator->GetExtraGeneratorName().c_str(),
                        "Name of external makefile project generator.",
                        cmStateEnums::INTERNAL);
  }

  if (const char* platformName =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_PLATFORM")) {
    if (this->GeneratorPlatform.empty()) {
      this->GeneratorPlatform = platformName;
    } else if (this->GeneratorPlatform != platformName) {
      std::string message = "Error: generator platform: ";
      message += this->GeneratorPlatform;
      message += "\nDoes not match the platform used previously: ";
      message += platformName;
      message += "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.";
      cmSystemTools::Error(message.c_str());
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_PLATFORM",
                        this->GeneratorPlatform.c_str(),
                        "Name of generator platform.", cmStateEnums::INTERNAL);
  }

  if (const char* tsName =
        this->State->GetInitializedCacheValue("CMAKE_GENERATOR_TOOLSET")) {
    if (this->GeneratorToolset.empty()) {
      this->GeneratorToolset = tsName;
    } else if (this->GeneratorToolset != tsName) {
      std::string message = "Error: generator toolset: ";
      message += this->GeneratorToolset;
      message += "\nDoes not match the toolset used previously: ";
      message += tsName;
      message += "\nEither remove the CMakeCache.txt file and CMakeFiles "
                 "directory or choose a different binary directory.";
      cmSystemTools::Error(message.c_str());
      return -2;
    }
  } else {
    this->AddCacheEntry("CMAKE_GENERATOR_TOOLSET",
                        this->GeneratorToolset.c_str(),
                        "Name of generator toolset.", cmStateEnums::INTERNAL);
  }

  // reset any system configuration information, except for when we are
  // InTryCompile. With TryCompile the system info is taken from the parent's
  // info to save time
  if (!this->State->GetIsInTryCompile()) {
    this->GlobalGenerator->ClearEnabledLanguages();

    this->TruncateOutputLog("CMakeOutput.log");
    this->TruncateOutputLog("CMakeError.log");
  }

  // actually do the configure
  this->GlobalGenerator->Configure();
  // Before saving the cache
  // if the project did not define one of the entries below, add them now
  // so users can edit the values in the cache:

  // We used to always present LIBRARY_OUTPUT_PATH and
  // EXECUTABLE_OUTPUT_PATH.  They are now documented as old-style and
  // should no longer be used.  Therefore we present them only if the
  // project requires compatibility with CMake 2.4.  We detect this
  // here by looking for the old CMAKE_BACKWARDS_COMPATIBILITY
  // variable created when CMP0001 is not set to NEW.
  if (this->State->GetInitializedCacheValue("CMAKE_BACKWARDS_COMPATIBILITY")) {
    if (!this->State->GetInitializedCacheValue("LIBRARY_OUTPUT_PATH")) {
      this->AddCacheEntry(
        "LIBRARY_OUTPUT_PATH", "",
        "Single output directory for building all libraries.",
        cmStateEnums::PATH);
    }
    if (!this->State->GetInitializedCacheValue("EXECUTABLE_OUTPUT_PATH")) {
      this->AddCacheEntry(
        "EXECUTABLE_OUTPUT_PATH", "",
        "Single output directory for building all executables.",
        cmStateEnums::PATH);
    }
  }

  cmMakefile* mf = this->GlobalGenerator->GetMakefiles()[0];
  if (mf->IsOn("CTEST_USE_LAUNCHERS") &&
      !this->State->GetGlobalProperty("RULE_LAUNCH_COMPILE")) {
    cmSystemTools::Error(
      "CTEST_USE_LAUNCHERS is enabled, but the "
      "RULE_LAUNCH_COMPILE global property is not defined.\n"
      "Did you forget to include(CTest) in the toplevel "
      "CMakeLists.txt ?");
  }

  // only save the cache if there were no fatal errors
  if (this->GetWorkingMode() == NORMAL_MODE) {
    this->SaveCache(this->GetHomeOutputDirectory());
  }
  if (cmSystemTools::GetErrorOccuredFlag()) {
    return -1;
  }
  return 0;
}